

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O1

void __thiscall Centaurus::ATNNode<wchar_t>::ATNNode(ATNNode<wchar_t> *this,ATNNode<wchar_t> *old)

{
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_001a2868;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (old->m_transitions).
       super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (old->m_transitions).
       super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (old->m_transitions).
       super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (old->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (old->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (old->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_type = old->m_type;
  (this->m_invoke)._vptr_Identifier = (_func_int **)&PTR__Identifier_001a0cd8;
  std::__cxx11::wstring::wstring((wstring *)&(this->m_invoke).m_id,(wstring *)&(old->m_invoke).m_id)
  ;
  (this->m_nfa).super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001a28f0;
  std::
  vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  ::vector(&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>.m_states,
           &(old->m_nfa).super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>.m_states);
  (this->m_nfa).super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001a2898;
  std::__cxx11::wstring::wstring((wstring *)&this->m_literal,(wstring *)&old->m_literal);
  this->m_localid = old->m_localid;
  return;
}

Assistant:

ATNNode(ATNNode<TCHAR>&& old)
        : m_transitions(std::move(old.m_transitions)), m_type(old.m_type), m_invoke(std::move(old.m_invoke)), m_nfa(std::move(old.m_nfa)), m_literal(std::move(old.m_literal)), m_localid(old.m_localid)
    {
    }